

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O0

void __thiscall
Move::set_all(Move *this,string *word,int r,int c,bool across,int score,int blank_pos,int h)

{
  int iVar1;
  int score_local;
  bool across_local;
  int c_local;
  int r_local;
  string *word_local;
  Move *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)word);
  iVar1 = std::__cxx11::string::size();
  this->length = iVar1;
  this->row = r;
  this->col = c;
  this->across = across;
  this->score = score;
  this->blank_pos = blank_pos;
  this->heur_score = h;
  return;
}

Assistant:

void
    set_all(const std::string &word, int r, int c, bool across, int score, int blank_pos, int h = 0) {
        this->word = word;
        this->length = word.size();
        this->row = r;
        this->col = c;
        this->across = across;
        this->score = score;
        this->blank_pos = blank_pos;
        this->heur_score = h;
    }